

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O3

int __thiscall MPEG2StreamReader::processSeqStartCode(MPEG2StreamReader *this,uint8_t *buff)

{
  byte *pbVar1;
  uint8_t *puVar2;
  long lVar3;
  byte *pbVar4;
  
  pbVar1 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  pbVar4 = buff + 2;
  do {
    if (pbVar1 <= pbVar4) {
      return -10;
    }
    lVar3 = 3;
    if (*pbVar4 < 2) {
      if (*pbVar4 == 0) {
        lVar3 = 1;
      }
      else if ((pbVar4[-2] == 0) && (pbVar4[-1] == 0)) {
        pbVar4 = pbVar4 + -2;
        if (pbVar4 == pbVar1) {
          return -10;
        }
        puVar2 = MPEGSequenceHeader::deserialize
                           (&this->m_sequence,buff + 1,(int64_t)(pbVar4 + ~(ulong)buff));
        if (puVar2 != (uint8_t *)0x0) {
          (this->super_MPEGStreamReader).m_streamAR = (uint)(this->m_sequence).aspect_ratio_info;
          MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,(void *)0x0,buff,pbVar4,0);
          this->spsFound = true;
          this->m_lastIFrame = true;
          return 0;
        }
        return 3;
      }
    }
    pbVar4 = pbVar4 + lVar3;
  } while( true );
}

Assistant:

int MPEG2StreamReader::processSeqStartCode(uint8_t* buff)
{
    uint8_t* nextNal = MPEGHeader::findNextMarker(buff, m_bufEnd);
    if (nextNal == m_bufEnd)
    {
        return NOT_ENOUGH_BUFFER;
    }
    try
    {
        if (m_sequence.deserialize(buff + 1, nextNal - buff - 1) == nullptr)
            return NALUnit::UNSUPPORTED_PARAM;
        m_streamAR = static_cast<VideoAspectRatio>(m_sequence.aspect_ratio_info);
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
    constexpr int oldSpsLen = 0;
    updateFPS(nullptr, buff, nextNal, oldSpsLen);
    spsFound = true;
    m_lastIFrame = true;
    return 0;
}